

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O3

Literal_t * Rpo_Factorize(uint *target,int nVars,int nThreshold,int verbose)

{
  Literal_t *__ptr;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Literal_t *pLVar6;
  Literal_t **vecLit;
  undefined4 in_register_00000014;
  uint uVar7;
  int iVar8;
  size_t __size;
  uint nLit;
  int thresholdCount;
  ulong local_40;
  undefined8 local_38;
  uint *puVar9;
  
  local_38 = CONCAT44(in_register_00000014,nThreshold);
  thresholdCount = 0;
  uVar2 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  uVar3 = uVar2;
  if (nVars < 6) {
    uVar2 = 1;
    uVar3 = uVar2;
  }
  do {
    if ((int)uVar2 < 1) {
      pVVar4 = (Vec_Str_t *)malloc(0x10);
      pVVar4->nCap = 0x10;
      pcVar5 = (char *)malloc(0x10);
      pVVar4->pArray = pcVar5;
      *pcVar5 = '0';
      goto LAB_005eadce;
    }
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while (target[lVar1] == 0);
  while (0 < (int)uVar3) {
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
    if (target[lVar1] != 0xffffffff) {
      if (verbose != 0) {
        puVar9 = target;
        Abc_Print((int)target,"Target: ");
        iVar8 = (int)puVar9;
        if (0 < nVars) {
          uVar2 = (ulong)(uint)nVars + 1;
          do {
            Abc_Print((int)puVar9,"%08X",(ulong)target[uVar2 - 2]);
            iVar8 = (int)puVar9;
            uVar2 = uVar2 - 1;
          } while (1 < uVar2);
        }
        Abc_Print(iVar8,"\n");
      }
      __size = (long)(nVars * 2) << 3;
      vecLit = (Literal_t **)malloc(__size);
      iVar8 = (int)__size;
      local_40 = 0;
      nLit = 0;
      if (0 < nVars) {
        uVar7 = nVars + 1;
        nLit = 0;
        do {
          pLVar6 = Lit_Alloc(target,nVars,uVar7 - 2,'+');
          if (pLVar6 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar6;
            nLit = nLit + 1;
          }
          puVar9 = target;
          pLVar6 = Lit_Alloc(target,nVars,uVar7 - 2,'-');
          iVar8 = (int)puVar9;
          if (pLVar6 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar6;
            nLit = nLit + 1;
          }
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      if (verbose != 0) {
        Abc_Print(iVar8,"Allocated %d literal clusters\n",(ulong)nLit);
        local_40 = (ulong)(uint)verbose;
      }
      pLVar6 = Rpo_Recursion(target,vecLit,nLit,nLit,nVars,&thresholdCount,(int)local_38,
                             (int)local_40);
      if ((int)nLit < 1) {
        if (vecLit == (Literal_t **)0x0) {
          return pLVar6;
        }
      }
      else {
        uVar2 = 0;
        do {
          __ptr = vecLit[uVar2];
          if (__ptr != (Literal_t *)0x0) {
            if (__ptr->function != (uint *)0x0) {
              free(__ptr->function);
              __ptr->function = (uint *)0x0;
            }
            if (__ptr->transition != (uint *)0x0) {
              free(__ptr->transition);
              __ptr->transition = (uint *)0x0;
            }
            pVVar4 = __ptr->expression;
            pcVar5 = pVVar4->pArray;
            if (pcVar5 != (char *)0x0) {
              free(pcVar5);
            }
            free(pVVar4);
            free(__ptr);
          }
          uVar2 = uVar2 + 1;
        } while (nLit != uVar2);
      }
      free(vecLit);
      return pLVar6;
    }
  }
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pcVar5 = (char *)malloc(0x10);
  pVVar4->pArray = pcVar5;
  *pcVar5 = '1';
LAB_005eadce:
  pVVar4->nSize = 2;
  pcVar5[1] = '\0';
  pLVar6 = (Literal_t *)malloc(0x18);
  pLVar6->expression = pVVar4;
  pLVar6->function = target;
  pLVar6->transition = target;
  return pLVar6;
}

Assistant:

Literal_t* Rpo_Factorize(unsigned* target, int nVars, int nThreshold, int verbose) {

    int nLitCap = nVars * 2;
    int nLit = 0;
    int w;
    Literal_t** vecLit;
    Literal_t* lit;
    Literal_t* result;
    int thresholdCount = 0;

    if (Kit_TruthIsConst0(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 0);
    } else if (Kit_TruthIsConst1(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 1);
    }

    //    if (nThreshold == -1) {
    //        nThreshold = nLitCap + nVars;
    //    }
    if (verbose) {
        Abc_Print(-2, "Target: ");
        Lit_PrintTT(target, nVars);
        Abc_Print(-2, "\n");
    }
    vecLit = ABC_ALLOC(Literal_t*, nLitCap);

    for (w = nVars - 1; w >= 0; w--) {
        lit = Lit_Alloc(target, nVars, w, '+');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
        lit = Lit_Alloc(target, nVars, w, '-');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
    }
    if (verbose) {
        Abc_Print(-2, "Allocated %d literal clusters\n", nLit);
    }

    result = Rpo_Recursion(target, vecLit, nLit, nLit, nVars, &thresholdCount, nThreshold, verbose);

    //freeing the memory
    for (w = 0; w < nLit; ++w) {
        Lit_Free(vecLit[w]);
    }
    ABC_FREE(vecLit);

    return result;

}